

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harris.cpp
# Opt level: O1

Harris * __thiscall Harris::GaussFilter(Harris *this,Mat *img,int range)

{
  long lVar1;
  int in_ECX;
  undefined4 in_register_00000014;
  long lVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  double dVar6;
  float fVar7;
  Mat *gauss;
  Mat gaussHelperV;
  long local_b8;
  Mat local_90 [16];
  long local_80;
  long *local_48;
  
  lVar2 = CONCAT44(in_register_00000014,range);
  cv::Mat::Mat(local_90,*(int *)(lVar2 + 8) + in_ECX * -2,*(int *)(lVar2 + 0xc) + in_ECX * -2,5);
  iVar5 = *(int *)(lVar2 + 8);
  if (in_ECX < iVar5 - in_ECX) {
    lVar1 = (long)in_ECX;
    local_b8 = lVar1;
    do {
      if (in_ECX < *(int *)(lVar2 + 0xc) - in_ECX) {
        lVar4 = lVar1;
        do {
          if (in_ECX < 0) {
            fVar7 = 0.0;
          }
          else {
            fVar7 = 0.0;
            iVar5 = in_ECX * 2 + 1;
            iVar3 = -in_ECX;
            do {
              dVar6 = exp((double)iVar3 * -0.5 * (double)iVar3);
              fVar7 = fVar7 + (float)(dVar6 * 0.3989422804014327) *
                              *(float *)(**(long **)(lVar2 + 0x48) * (local_b8 - lVar1) +
                                         *(long *)(lVar2 + 0x10) + (lVar4 - lVar1) * 4);
              iVar3 = iVar3 + 1;
              iVar5 = iVar5 + -1;
            } while (iVar5 != 0);
          }
          *(float *)(*local_48 * (local_b8 - lVar1) + local_80 + (lVar4 - lVar1) * 4) = fVar7;
          lVar4 = lVar4 + 1;
        } while (lVar4 < *(int *)(lVar2 + 0xc) - lVar1);
      }
      local_b8 = local_b8 + 1;
      iVar5 = *(int *)(lVar2 + 8);
    } while (local_b8 < iVar5 - in_ECX);
  }
  cv::Mat::Mat(&this->harrisResponses,iVar5 + in_ECX * -2,*(int *)(lVar2 + 0xc) + in_ECX * -2,5);
  if (in_ECX < *(int *)(lVar2 + 8) - in_ECX) {
    lVar1 = (long)in_ECX;
    local_b8 = lVar1;
    do {
      if (in_ECX < *(int *)(lVar2 + 0xc) - in_ECX) {
        lVar4 = lVar1;
        do {
          if (in_ECX < 0) {
            fVar7 = 0.0;
          }
          else {
            fVar7 = 0.0;
            iVar5 = in_ECX * 2 + 1;
            iVar3 = -in_ECX;
            do {
              dVar6 = exp((double)iVar3 * -0.5 * (double)iVar3);
              fVar7 = fVar7 + (float)(dVar6 * 0.3989422804014327) *
                              *(float *)(*local_48 * (local_b8 - lVar1) + local_80 +
                                        (lVar4 - lVar1) * 4);
              iVar3 = iVar3 + 1;
              iVar5 = iVar5 + -1;
            } while (iVar5 != 0);
          }
          *(float *)(**(long **)&this->field_0x48 * (local_b8 - lVar1) + *(long *)&this->field_0x10
                    + (lVar4 - lVar1) * 4) = fVar7;
          lVar4 = lVar4 + 1;
        } while (lVar4 < *(int *)(lVar2 + 0xc) - lVar1);
      }
      local_b8 = local_b8 + 1;
    } while (local_b8 < *(int *)(lVar2 + 8) - lVar1);
  }
  cv::Mat::~Mat(local_90);
  return this;
}

Assistant:

Mat Harris::GaussFilter(Mat& img, int range) {
    // Helper Mats for better time complexity
    Mat gaussHelperV(img.rows-range*2, img.cols-range*2, CV_32F);
    for(int r=range; r<img.rows-range; r++) {
        for(int c=range; c<img.cols-range; c++) {
            float res = 0;

            for(int x = -range; x<=range; x++) {
                float m = 1/sqrt(2*M_PI)*exp(-0.5*x*x);

                res += m * img.at<float>(r-range,c-range);
            }

            gaussHelperV.at<float>(r-range,c-range) = res;
        }
    }

    Mat gauss(img.rows-range*2, img.cols-range*2, CV_32F);
    for(int r=range; r<img.rows-range; r++) {
        for(int c=range; c<img.cols-range; c++) {
            float res = 0;

            for(int x = -range; x<=range; x++) {
                float m = 1/sqrt(2*M_PI)*exp(-0.5*x*x);

                res += m * gaussHelperV.at<float>(r-range,c-range);
            }

            gauss.at<float>(r-range,c-range) = res;
        }
    }

    return gauss;
}